

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Error __thiscall llvm::sys::fs::TempFile::keep(TempFile *this)

{
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  error_category *__cat;
  size_t extraout_RDX;
  byte *in_RSI;
  StringRef Filename;
  error_code EC_00;
  Error local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  error_code EC;
  char *local_30;
  TempFile *this_local;
  
  if (((*in_RSI ^ 0xff) & 1) == 0) {
    __assert_fail("!Done",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                  ,0x49f,"Error llvm::sys::fs::TempFile::keep()");
  }
  *in_RSI = 1;
  EC._M_cat = (error_category *)std::__cxx11::string::data();
  std::__cxx11::string::length();
  Filename.Length = extraout_RDX;
  Filename.Data = local_30;
  DontRemoveFileOnSignal((sys *)EC._M_cat,Filename);
  std::__cxx11::string::operator=((string *)(in_RSI + 8),"");
  iVar2 = close(*(int *)(in_RSI + 0x28));
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    __cat = (error_category *)std::_V2::generic_category();
    std::error_code::error_code((error_code *)local_48,iVar2,__cat);
    local_58._0_8_ = local_48;
    uVar1 = local_58._0_8_;
    local_58._8_8_ = EC._0_8_;
    local_58._0_4_ = local_48._0_4_;
    EC_00._M_cat._0_4_ = local_58._0_4_;
    EC_00._0_8_ = this;
    EC_00._M_cat._4_4_ = 0;
    local_58._0_8_ = uVar1;
    errorCodeToError(EC_00);
  }
  else {
    in_RSI[0x28] = 0xff;
    in_RSI[0x29] = 0xff;
    in_RSI[0x2a] = 0xff;
    in_RSI[0x2b] = 0xff;
    Error::success();
    Error::Error((Error *)this,&local_60);
    ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_60);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error TempFile::keep() {
  assert(!Done);
  Done = true;

#ifdef _WIN32
  auto H = reinterpret_cast<HANDLE>(_get_osfhandle(FD));
  if (std::error_code EC = setDeleteDisposition(H, false))
    return errorCodeToError(EC);
#else
  sys::DontRemoveFileOnSignal(TmpName);
#endif

  TmpName = "";

  if (close(FD) == -1) {
    std::error_code EC(errno, std::generic_category());
    return errorCodeToError(EC);
  }
  FD = -1;

  return Error::success();
}